

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O2

bool __thiscall asmjit::CodeCompiler::getSaveOnUnuse(CodeCompiler *this,Reg *reg)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = (reg->super_Operand).super_Operand_.field_0._any.id;
  if (uVar1 < 0x100) {
    bVar2 = false;
  }
  else {
    if (uVar1 == 0xffffffff) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/../base/codecompiler.h"
                 ,0x2a6,"id != kInvalidValue");
    }
    if ((this->_vRegArray).super_ZoneVectorBase._length <= (ulong)(uVar1 - 0x100)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/../base/codecompiler.h"
                 ,0x2a9,"index < _vRegArray.getLength()");
    }
    bVar2 = (bool)((*(byte *)(*(long *)((long)(this->_vRegArray).super_ZoneVectorBase._data +
                                       (ulong)(uVar1 - 0x100) * 8) + 0x17) & 8) >> 3);
  }
  return bVar2;
}

Assistant:

bool CodeCompiler::getSaveOnUnuse(Reg& reg) const {
  if (!reg.isVirtReg()) return false;

  VirtReg* vreg = getVirtRegById(reg.getId());
  return static_cast<bool>(vreg->_saveOnUnuse);
}